

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryReader::verifyInt8(WasmBinaryReader *this,int8_t x)

{
  uint8_t uVar1;
  string local_40;
  
  uVar1 = getInt8(this);
  if (uVar1 == x) {
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"surprising value","");
  throwError(this,&local_40);
}

Assistant:

void WasmBinaryReader::verifyInt8(int8_t x) {
  int8_t y = getInt8();
  if (x != y) {
    throwError("surprising value");
  }
}